

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O0

void __thiscall
duckdb_parquet::SchemaElement::SchemaElement(SchemaElement *this,SchemaElement *other57)

{
  long in_RSI;
  TBase *in_RDI;
  LogicalType *other53;
  LogicalType *this_00;
  
  duckdb_apache::thrift::TBase::TBase(in_RDI);
  in_RDI->_vptr_TBase = (_func_int **)&PTR__SchemaElement_03540380;
  in_RDI->_vptr_TBase = (_func_int **)&PTR__SchemaElement_03540380;
  other53 = (LogicalType *)(in_RDI + 3);
  std::__cxx11::string::string((string *)other53);
  this_00 = (LogicalType *)(in_RDI + 10);
  LogicalType::LogicalType(this_00);
  _SchemaElement__isset::_SchemaElement__isset((_SchemaElement__isset *)(in_RDI + 0x28));
  *(undefined4 *)&in_RDI[1]._vptr_TBase = *(undefined4 *)(in_RSI + 8);
  *(undefined4 *)((long)&in_RDI[1]._vptr_TBase + 4) = *(undefined4 *)(in_RSI + 0xc);
  *(undefined4 *)&in_RDI[2]._vptr_TBase = *(undefined4 *)(in_RSI + 0x10);
  std::__cxx11::string::operator=((string *)(in_RDI + 3),(string *)(in_RSI + 0x18));
  *(undefined4 *)&in_RDI[7]._vptr_TBase = *(undefined4 *)(in_RSI + 0x38);
  *(undefined4 *)((long)&in_RDI[7]._vptr_TBase + 4) = *(undefined4 *)(in_RSI + 0x3c);
  *(undefined4 *)&in_RDI[8]._vptr_TBase = *(undefined4 *)(in_RSI + 0x40);
  *(undefined4 *)((long)&in_RDI[8]._vptr_TBase + 4) = *(undefined4 *)(in_RSI + 0x44);
  *(undefined4 *)&in_RDI[9]._vptr_TBase = *(undefined4 *)(in_RSI + 0x48);
  LogicalType::operator=(this_00,other53);
  *(undefined2 *)&in_RDI[0x28]._vptr_TBase = *(undefined2 *)(in_RSI + 0x140);
  return;
}

Assistant:

SchemaElement::SchemaElement(const SchemaElement& other57) {
  type = other57.type;
  type_length = other57.type_length;
  repetition_type = other57.repetition_type;
  name = other57.name;
  num_children = other57.num_children;
  converted_type = other57.converted_type;
  scale = other57.scale;
  precision = other57.precision;
  field_id = other57.field_id;
  logicalType = other57.logicalType;
  __isset = other57.__isset;
}